

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

Maybe<capnp::Schema> __thiscall
capnp::SchemaLoader::tryGet(SchemaLoader *this,uint64_t id,Reader brand,Schema scope)

{
  CapTableReader *pCVar1;
  long lVar2;
  undefined8 *puVar3;
  Exception *pEVar4;
  Waiter *pWVar5;
  long *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_03;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar6;
  LazyLoadCallback *_c2155;
  RawSchema *schema;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Maybe<capnp::Schema> MVar12;
  PointerReader local_a8;
  long *local_88;
  RawBrandedSchema *local_80;
  ListReader local_78;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_48;
  
  local_78.segment._0_1_ = 0;
  local_88 = in_RCX;
  kj::_::Mutex::lock((Mutex *)id,1);
  pCVar1 = (CapTableReader *)(id + 0x18);
  lVar2 = *(long *)(id + 0x20);
  local_a8.segment = (SegmentReader *)id;
  local_a8.capTable = pCVar1;
  local_80 = scope.raw;
  kj::
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  ::find<0ul,unsigned_long&>
            ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
              *)&local_78,(unsigned_long *)(lVar2 + 0x68));
  if (CONCAT71(local_78.segment._1_7_,local_78.segment._0_1_) == 0) {
    schema = (RawSchema *)0x0;
  }
  else {
    schema = *(RawSchema **)(CONCAT71(local_78.segment._1_7_,local_78.segment._0_1_) + 8);
  }
  puVar3 = *(undefined8 **)(lVar2 + 0x198);
  kj::_::Mutex::unlock((Mutex *)id,SHARED,(Waiter *)0x0);
  if ((schema == (RawSchema *)0x0) || (schema->lazyInitializer != (Initializer *)0x0)) {
    if (puVar3 != (undefined8 *)0x0) {
      (**(code **)*puVar3)(puVar3,id,scope.raw);
    }
    local_78.segment._0_1_ = 0;
    kj::_::Mutex::lock((Mutex *)id,1);
    local_a8.segment = (SegmentReader *)id;
    local_a8.capTable = pCVar1;
    local_80 = scope.raw;
    kj::
    Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
    ::find<0ul,unsigned_long&>
              ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                *)&local_78,(unsigned_long *)(*(long *)(id + 0x20) + 0x68));
    if (CONCAT71(local_78.segment._1_7_,local_78.segment._0_1_) == 0) {
      schema = (RawSchema *)0x0;
    }
    else {
      schema = *(RawSchema **)(CONCAT71(local_78.segment._1_7_,local_78.segment._0_1_) + 8);
    }
    kj::_::Mutex::unlock((Mutex *)id,SHARED,(Waiter *)0x0);
    if ((schema == (RawSchema *)0x0) || (schema->lazyInitializer != (Initializer *)0x0)) {
      *(undefined1 *)&(this->impl).mutex.futex = 0;
      aVar6 = extraout_RDX;
      goto LAB_001a746a;
    }
  }
  bVar7 = brand._reader.pointerCount == 0;
  local_a8.pointer = brand._reader.pointers;
  if (bVar7) {
    local_a8.pointer = (WirePointer *)0x0;
  }
  local_a8.nestingLimit = 0x7fffffff;
  if (!bVar7) {
    local_a8.nestingLimit = brand._reader.nestingLimit;
  }
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  if (!bVar7) {
    uVar8 = brand._reader.segment._0_4_;
    uVar9 = brand._reader.segment._4_4_;
    uVar10 = brand._reader.capTable._0_4_;
    uVar11 = brand._reader.capTable._4_4_;
  }
  local_a8.segment = (SegmentReader *)CONCAT44(uVar9,uVar8);
  local_a8.capTable = (CapTableReader *)CONCAT44(uVar11,uVar10);
  capnp::_::PointerReader::getList(&local_78,&local_a8,INLINE_COMPOSITE,(word *)0x0);
  if (local_78.elementCount == 0) {
    *(undefined1 *)&(this->impl).mutex.futex = 1;
    (this->impl).mutex.waitersHead.ptr = (Waiter *)&schema->defaultBrand;
    aVar6 = extraout_RDX_00;
  }
  else {
    local_78.segment._0_1_ = 0;
    bVar7 = false;
    kj::_::Mutex::lock((Mutex *)id,0);
    if (((ulong)*(uint *)(local_88 + 3) != 0) || ((long *)(*local_88 + 0x48) == local_88)) {
      local_48.ptr.field_1.value.ptr = (Scope *)local_88[1];
      bVar7 = true;
      local_48.ptr.field_1.value.size_ = (ulong)*(uint *)(local_88 + 3);
    }
    local_a8.segment = (SegmentReader *)id;
    local_a8.capTable = pCVar1;
    local_48.ptr.isSet = bVar7;
    pWVar5 = (Waiter *)Impl::makeBranded(*(Impl **)(id + 0x20),schema,brand,&local_48);
    aVar6 = extraout_RDX_01;
    if (local_a8.segment != (SegmentReader *)0x0) {
      kj::_::Mutex::unlock((Mutex *)local_a8.segment,EXCLUSIVE,(Waiter *)0x0);
      aVar6 = extraout_RDX_02;
    }
    pEVar4 = (pWVar5->exception).ptr.ptr;
    if (pEVar4 != (Exception *)0x0) {
      (**(_func_int **)(pEVar4->ownFile).content.ptr)(pEVar4,pWVar5);
      aVar6 = extraout_RDX_03;
    }
    *(undefined1 *)&(this->impl).mutex.futex = 1;
    (this->impl).mutex.waitersHead.ptr = pWVar5;
  }
LAB_001a746a:
  MVar12.ptr.field_1 = aVar6;
  MVar12.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar12.ptr;
}

Assistant:

kj::Maybe<Schema> SchemaLoader::tryGet(
    uint64_t id, schema::Brand::Reader brand, Schema scope) const {
  auto getResult = impl.lockShared()->get()->tryGet(id);
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // This schema couldn't be found or has yet to be lazily loaded. If we have a lazy loader
    // callback, invoke it now to try to get it to load this schema.
    KJ_IF_SOME(c, getResult.callback) {
      c.load(*this, id);
    }
    getResult = impl.lockShared()->get()->tryGet(id);
  }
  if (getResult.schema != nullptr && getResult.schema->lazyInitializer == nullptr) {
    if (brand.getScopes().size() > 0) {
      auto brandedSchema = impl.lockExclusive()->get()->makeBranded(
          getResult.schema, brand,
          scope.raw->isUnbound()
              ? kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>>(kj::none)
              : kj::arrayPtr(scope.raw->scopes, scope.raw->scopeCount));
      brandedSchema->ensureInitialized();
      return Schema(brandedSchema);
    } else {
      return Schema(&getResult.schema->defaultBrand);
    }
  } else {
    return kj::none;
  }
}